

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_motion(t_my_numbox *x,t_floatarg dx,t_floatarg dy,t_floatarg up)

{
  double dVar1;
  double local_28;
  double k2;
  t_floatarg up_local;
  t_floatarg dy_local;
  t_floatarg dx_local;
  t_my_numbox *x_local;
  
  local_28 = 1.0;
  if ((up == 0.0) && (!NAN(up))) {
    if (((uint)(x->x_gui).x_fsf >> 0x19 & 1) != 0) {
      local_28 = 0.01;
    }
    if (x->x_lin0_log1 == 0) {
      x->x_val = (float)(-local_28 * (double)dy + (double)x->x_val);
    }
    else {
      dVar1 = pow(x->x_k,-local_28 * (double)dy);
      x->x_val = (float)((double)x->x_val * dVar1);
    }
    my_numbox_clip(x);
    sys_queuegui(x,(x->x_gui).x_glist,my_numbox_draw_update);
    my_numbox_bang(x);
  }
  return;
}

Assistant:

static void my_numbox_motion(t_my_numbox *x, t_floatarg dx, t_floatarg dy,
    t_floatarg up)
{
    double k2 = 1.0;
    if (up != 0)
        return;

    if(x->x_gui.x_fsf.x_finemoved)
        k2 = 0.01;
    if(x->x_lin0_log1)
        x->x_val *= pow(x->x_k, -k2*dy);
    else
        x->x_val -= k2*dy;
    my_numbox_clip(x);
    sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    my_numbox_bang(x);
}